

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaWrite.c
# Opt level: O0

void Pla_WritePla(Pla_Man_t *p,char *pFileName)

{
  int iVar1;
  FILE *__s;
  char *__ptr;
  FILE *pFile;
  Vec_Str_t *vOut;
  char *pFileName_local;
  Pla_Man_t *p_local;
  
  vOut = (Vec_Str_t *)pFileName;
  pFileName_local = (char *)p;
  pFile = (FILE *)Pla_WritePlaInt(p);
  iVar1 = Vec_StrSize((Vec_Str_t *)pFile);
  if (0 < iVar1) {
    __s = fopen((char *)vOut,"wb");
    if (__s == (FILE *)0x0) {
      printf("Cannot open file \"%s\" for writing.\n",vOut);
    }
    else {
      __ptr = Vec_StrArray((Vec_Str_t *)pFile);
      iVar1 = Vec_StrSize((Vec_Str_t *)pFile);
      fwrite(__ptr,1,(long)iVar1,__s);
      fclose(__s);
    }
  }
  Vec_StrFreeP((Vec_Str_t **)&pFile);
  return;
}

Assistant:

void Pla_WritePla( Pla_Man_t * p, char * pFileName )
{
    Vec_Str_t * vOut = Pla_WritePlaInt( p );
    if ( Vec_StrSize(vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFreeP( &vOut );
}